

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

int __thiscall
Catch::Session::applyCommandLine(Session *this,int argc,char **argv,DoWhat unusedOptionBehaviour)

{
  int in_ECX;
  long in_RDI;
  Colour colourGuard;
  exception *ex;
  Ptr<Catch::Config> *in_stack_fffffffffffffed0;
  string *in_stack_fffffffffffffed8;
  Session *in_stack_fffffffffffffee0;
  ConfigData *in_stack_ffffffffffffff80;
  char **in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff94;
  CommandLine<Catch::ConfigData> *in_stack_ffffffffffffff98;
  
  Clara::CommandLine<Catch::ConfigData>::setThrowOnUnrecognisedTokens
            ((CommandLine<Catch::ConfigData> *)(in_RDI + 8),in_ECX == 1);
  Clara::CommandLine<Catch::ConfigData>::parseInto
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,in_stack_ffffffffffffff88,
             in_stack_ffffffffffffff80);
  std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::operator=
            ((vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *)
             in_stack_fffffffffffffee0,
             (vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *)
             in_stack_fffffffffffffed8);
  std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::~vector
            ((vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *)
             in_stack_fffffffffffffee0);
  if ((*(byte *)(in_RDI + 0x87) & 1) != 0) {
    showHelp(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  }
  Ptr<Catch::Config>::reset(in_stack_fffffffffffffed0);
  return 0;
}

Assistant:

int applyCommandLine( int argc, char const* const argv[], OnUnusedOptions::DoWhat unusedOptionBehaviour = OnUnusedOptions::Fail ) {
            try {
                m_cli.setThrowOnUnrecognisedTokens( unusedOptionBehaviour == OnUnusedOptions::Fail );
                m_unusedTokens = m_cli.parseInto( argc, argv, m_configData );
                if( m_configData.showHelp )
                    showHelp( m_configData.processName );
                m_config.reset();
            }
            catch( std::exception& ex ) {
                {
                    Colour colourGuard( Colour::Red );
                    Catch::cerr()
                        << "\nError(s) in input:\n"
                        << Text( ex.what(), TextAttributes().setIndent(2) )
                        << "\n\n";
                }
                m_cli.usage( Catch::cout(), m_configData.processName );
                return (std::numeric_limits<int>::max)();
            }
            return 0;
        }